

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape_on_grid.h
# Opt level: O2

void __thiscall
Gudhi::Persistence_representations::Persistence_landscape_on_grid::set_up_values_of_landscapes
          (Persistence_landscape_on_grid *this,
          vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *p,
          double grid_min_,double grid_max_,size_t number_of_points_,uint number_of_levels)

{
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *pvVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  pointer ppVar3;
  pointer pvVar4;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var5;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var6;
  pointer pdVar7;
  Persistence_landscape_on_grid *pPVar8;
  double *pdVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined8 *puVar13;
  long lVar14;
  size_t j;
  long lVar15;
  size_t pt_1;
  long lVar16;
  bool bVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  pointer pvVar22;
  double local_88;
  double local_80;
  double local_78;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *local_70;
  ulong local_68;
  ulong local_60;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_58;
  Persistence_landscape_on_grid *local_40;
  long local_38;
  
  local_88 = grid_max_;
  if (((grid_min_ == 1.79769313486232e+308) && (!NAN(grid_min_))) ||
     ((local_80 = grid_min_, grid_max_ == 1.79769313486232e+308 && (!NAN(grid_max_))))) {
    ppVar3 = (p->
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar14 = (long)(p->
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3 >> 4;
    pdVar9 = &ppVar3->second;
    local_88 = 2.2250738585072014e-308;
    dVar18 = 1.79769313486232e+308;
    while (bVar17 = lVar14 != 0, lVar14 = lVar14 + -1, bVar17) {
      dVar21 = ((pair<double,_double> *)(pdVar9 + -1))->first;
      if (dVar18 <= ((pair<double,_double> *)(pdVar9 + -1))->first) {
        dVar21 = dVar18;
      }
      dVar18 = *pdVar9;
      if (*pdVar9 <= local_88) {
        dVar18 = local_88;
      }
      pdVar9 = pdVar9 + 2;
      local_88 = dVar18;
      dVar18 = dVar21;
    }
    if ((grid_min_ == 1.79769313486232e+308) && (!NAN(grid_min_))) {
      local_88 = grid_max_;
    }
    local_80 = grid_min_;
    if ((grid_min_ == 1.79769313486232e+308) && (local_80 = grid_min_, !NAN(grid_min_))) {
      local_80 = dVar18;
    }
  }
  local_70 = p;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_58,number_of_points_ + 1,(allocator_type *)&local_78);
  pvVar1 = &this->values_of_landscapes;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::_M_move_assign(pvVar1,&local_58);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_58);
  this->grid_min = local_80;
  this->grid_max = local_88;
  local_40 = this;
  if (local_80 < local_88) {
    auVar19._8_4_ = (int)(number_of_points_ >> 0x20);
    auVar19._0_8_ = number_of_points_;
    auVar19._12_4_ = 0x45300000;
    pvVar22 = (pointer)((local_88 - local_80) /
                       ((auVar19._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)number_of_points_) - 4503599627370496.0)));
    local_60 = (ulong)number_of_levels;
    local_68 = (ulong)(number_of_levels - 1);
    for (lVar14 = 0; pPVar8 = local_40,
        ppVar3 = (local_70->
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
        lVar14 != (long)(local_70->
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3 >> 4;
        lVar14 = lVar14 + 1) {
      dVar18 = (ppVar3[lVar14].first - local_80) / (double)pvVar22;
      uVar10 = (ulong)dVar18;
      uVar10 = (long)(dVar18 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f | uVar10;
      dVar18 = (ppVar3[lVar14].second - local_80) / (double)pvVar22;
      uVar11 = (ulong)dVar18;
      uVar11 = (long)(dVar18 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11;
      lVar16 = uVar10 + uVar11;
      auVar20._8_4_ = (int)((ulong)lVar16 >> 0x20);
      auVar20._0_8_ = lVar16;
      auVar20._12_4_ = 0x45300000;
      dVar18 = ((auVar20._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar16) - 4503599627370496.0)) * 0.5;
      uVar12 = (ulong)dVar18;
      uVar12 = (long)(dVar18 - 9.223372036854776e+18) & (long)uVar12 >> 0x3f | uVar12;
      local_58.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pvVar22;
      lVar16 = uVar10 * 0x18;
      local_38 = lVar14;
      while( true ) {
        lVar14 = local_38;
        uVar10 = uVar10 + 1;
        if (uVar12 <= uVar10) break;
        pvVar4 = (pvVar1->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pvVar2 = (vector<double,_std::allocator<double>_> *)
                 ((long)&pvVar4[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + lVar16);
        if (number_of_levels == 0xffffffff) {
          std::vector<double,_std::allocator<double>_>::push_back
                    (pvVar2,(value_type_conflict *)&local_58);
        }
        else {
          _Var5._M_current =
               *(double **)
                ((long)&pvVar4[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data + lVar16);
          _Var6._M_current =
               *(double **)
                ((long)&pvVar4[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data + lVar16 + 8);
          if ((ulong)((long)_Var6._M_current - (long)_Var5._M_current >> 3) < local_60) {
            local_78 = -(double)local_58.
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
            std::vector<double,_std::allocator<double>_>::emplace_back<double>(pvVar2,&local_78);
            pvVar4 = (pvVar1->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            _Var5._M_current =
                 *(double **)
                  ((long)&pvVar4[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data + lVar16);
            _Var6._M_current =
                 *(double **)
                  ((long)&pvVar4[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data + lVar16 + 8);
            if ((long)_Var6._M_current - (long)_Var5._M_current >> 3 == local_68) {
              std::
              make_heap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                        (_Var5,_Var6);
            }
          }
          else if (-(double)local_58.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start < *_Var5._M_current) {
            std::
            pop_heap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                      (_Var5,_Var6);
            pvVar4 = (pvVar1->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            _Var5._M_current =
                 *(double **)
                  ((long)&pvVar4[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data + lVar16);
            _Var6._M_current =
                 *(double **)
                  ((long)&pvVar4[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data + lVar16 + 8);
            _Var6._M_current[-1] =
                 -(double)local_58.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            std::
            push_heap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                      (_Var5,_Var6);
          }
        }
        local_58.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((double)local_58.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + (double)pvVar22);
        lVar16 = lVar16 + 0x18;
      }
      lVar16 = uVar12 * 0x18;
      for (; uVar12 <= uVar11; uVar12 = uVar12 + 1) {
        if (0.0 < (double)local_58.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) {
          pvVar4 = (pvVar1->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pvVar2 = (vector<double,_std::allocator<double>_> *)
                   ((long)&(pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar16);
          if (number_of_levels == 0xffffffff) {
            std::vector<double,_std::allocator<double>_>::push_back
                      (pvVar2,(value_type_conflict *)&local_58);
          }
          else {
            _Var5._M_current =
                 *(double **)
                  ((long)&(pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data + lVar16);
            _Var6._M_current =
                 *(double **)
                  ((long)&(pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data + lVar16 + 8);
            if ((ulong)((long)_Var6._M_current - (long)_Var5._M_current >> 3) < local_60) {
              local_78 = -(double)local_58.
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
              std::vector<double,_std::allocator<double>_>::emplace_back<double>(pvVar2,&local_78);
              pvVar4 = (pvVar1->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              _Var5._M_current =
                   *(double **)
                    ((long)&(pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data + lVar16);
              _Var6._M_current =
                   *(double **)
                    ((long)&(pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data + lVar16 + 8);
              if ((long)_Var6._M_current - (long)_Var5._M_current >> 3 == local_68) {
                std::
                make_heap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                          (_Var5,_Var6);
              }
            }
            else if (-(double)local_58.
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start < *_Var5._M_current) {
              std::
              pop_heap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                        (_Var5,_Var6);
              pvVar4 = (pvVar1->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              _Var5._M_current =
                   *(double **)
                    ((long)&(pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data + lVar16);
              _Var6._M_current =
                   *(double **)
                    ((long)&(pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data + lVar16 + 8);
              _Var6._M_current[-1] =
                   -(double)local_58.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
              std::
              push_heap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                        (_Var5,_Var6);
            }
          }
        }
        local_58.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((double)local_58.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start - (double)pvVar22);
        lVar16 = lVar16 + 0x18;
      }
    }
    if (number_of_levels != 0xffffffff) {
      pvVar22 = (local_40->values_of_landscapes).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar4 = (local_40->values_of_landscapes).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (lVar14 = 0; lVar14 != ((long)pvVar4 - (long)pvVar22) / 0x18; lVar14 = lVar14 + 1) {
        lVar16 = *(long *)&pvVar22[lVar14].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data;
        pdVar7 = *(pointer *)
                  ((long)&pvVar22[lVar14].super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data + 8);
        for (lVar15 = 0; (long)pdVar7 - lVar16 >> 3 != lVar15; lVar15 = lVar15 + 1) {
          *(ulong *)(lVar16 + lVar15 * 8) = *(ulong *)(lVar16 + lVar15 * 8) ^ 0x8000000000000000;
        }
      }
    }
    lVar14 = 8;
    lVar16 = 0;
    while( true ) {
      pvVar22 = (pPVar8->values_of_landscapes).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar15 = (long)(pPVar8->values_of_landscapes).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar22;
      if (lVar16 == lVar15 / 0x18) break;
      std::
      __sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<double>>>
                (*(undefined8 *)((long)pvVar22 + lVar14 + -8),
                 *(undefined8 *)
                  ((long)&(pvVar22->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data + lVar14),lVar15 % 0x18);
      lVar16 = lVar16 + 1;
      lVar14 = lVar14 + 0x18;
    }
    return;
  }
  puVar13 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar13 = 
  "Wrong parameters of grid_min and grid_max given to the procedure. The program will now terminate.\n"
  ;
  __cxa_throw(puVar13,&char_const*::typeinfo,0);
}

Assistant:

void Persistence_landscape_on_grid::set_up_values_of_landscapes(const std::vector<std::pair<double, double> >& p,
                                                                double grid_min_, double grid_max_,
                                                                size_t number_of_points_, unsigned number_of_levels) {
  bool dbg = false;
  if (dbg) {
    std::clog << "Here is the procedure : set_up_values_of_landscapes. The parameters are : grid_min_ : " << grid_min_
              << ", grid_max_ : " << grid_max_ << ", number_of_points_ : " << number_of_points_
              << ", number_of_levels: " << number_of_levels << std::endl;
    std::clog << "Here are the intervals at our disposal : \n";
    for (size_t i = 0; i != p.size(); ++i) {
      std::clog << p[i].first << " , " << p[i].second << std::endl;
    }
  }

  if ((grid_min_ == std::numeric_limits<double>::max()) || (grid_max_ == std::numeric_limits<double>::max())) {
    // in this case, we need to find grid_min_ and grid_min_ based on the data.
    double min = std::numeric_limits<double>::max();
    double max = std::numeric_limits<double>::min();
    for (size_t i = 0; i != p.size(); ++i) {
      if (p[i].first < min) min = p[i].first;
      if (p[i].second > max) max = p[i].second;
    }
    if (grid_min_ == std::numeric_limits<double>::max()) {
      grid_min_ = min;
    } else {
      // in this case grid_max_ == std::numeric_limits<double>::max()
      grid_max_ = max;
    }
  }

  // if number_of_levels == std::numeric_limits<size_t>::max(), then we will have all the nonzero values of landscapes,
  // and will store them in a vector
  // if number_of_levels != std::numeric_limits<size_t>::max(), then we will use those vectors as heaps.
  this->values_of_landscapes = std::vector<std::vector<double> >(number_of_points_ + 1);

  this->grid_min = grid_min_;
  this->grid_max = grid_max_;

  if (grid_max_ <= grid_min_) {
    throw "Wrong parameters of grid_min and grid_max given to the procedure. The program will now terminate.\n";
  }

  double dx = (grid_max_ - grid_min_) / static_cast<double>(number_of_points_);
  // for every interval in the diagram:
  for (size_t int_no = 0; int_no != p.size(); ++int_no) {
    size_t grid_interval_begin = (p[int_no].first - grid_min_) / dx;
    size_t grid_interval_end = (p[int_no].second - grid_min_) / dx;
    size_t grid_interval_midpoint = (size_t)(0.5 * (grid_interval_begin + grid_interval_end));

    if (dbg) {
      std::clog << "Considering an interval : " << p[int_no].first << "," << p[int_no].second << std::endl;

      std::clog << "grid_interval_begin : " << grid_interval_begin << std::endl;
      std::clog << "grid_interval_end : " << grid_interval_end << std::endl;
      std::clog << "grid_interval_midpoint : " << grid_interval_midpoint << std::endl;
    }

    double landscape_value = dx;
    for (size_t i = grid_interval_begin + 1; i < grid_interval_midpoint; ++i) {
      if (dbg) {
        std::clog << "Adding landscape value (going up) for a point : " << i << " equal : " << landscape_value
                  << std::endl;
      }
      if (number_of_levels != std::numeric_limits<unsigned>::max()) {
        // we have a heap of no more that number_of_levels values.
        // Note that if we are using heaps, we want to know the shortest distance in the heap.
        // This is achieved by putting -distance to the heap.
        if (this->values_of_landscapes[i].size() >= number_of_levels) {
          // in this case, the full heap is build, and we need to check if the landscape_value is not larger than the
          // smallest element in the heap.
          if (-landscape_value < this->values_of_landscapes[i].front()) {
            // if it is, we remove the largest value in the heap, and move on.
            std::pop_heap(this->values_of_landscapes[i].begin(), this->values_of_landscapes[i].end());
            this->values_of_landscapes[i][this->values_of_landscapes[i].size() - 1] = -landscape_value;
            std::push_heap(this->values_of_landscapes[i].begin(), this->values_of_landscapes[i].end());
          }
        } else {
          // in this case we are still filling in the array.
          this->values_of_landscapes[i].push_back(-landscape_value);
          if (this->values_of_landscapes[i].size() == number_of_levels - 1) {
            // this->values_of_landscapes[i].size() == number_of_levels
            // in this case we need to create the heap.
            std::make_heap(this->values_of_landscapes[i].begin(), this->values_of_landscapes[i].end());
          }
        }
      } else {
        // we have vector of all values
        this->values_of_landscapes[i].push_back(landscape_value);
      }
      landscape_value += dx;
    }
    for (size_t i = grid_interval_midpoint; i <= grid_interval_end; ++i) {
      if (landscape_value > 0) {
        if (number_of_levels != std::numeric_limits<unsigned>::max()) {
          // we have a heap of no more that number_of_levels values
          if (this->values_of_landscapes[i].size() >= number_of_levels) {
            // in this case, the full heap is build, and we need to check if the landscape_value is not larger than the
            // smallest element in the heap.
            if (-landscape_value < this->values_of_landscapes[i].front()) {
              // if it is, we remove the largest value in the heap, and move on.
              std::pop_heap(this->values_of_landscapes[i].begin(), this->values_of_landscapes[i].end());
              this->values_of_landscapes[i][this->values_of_landscapes[i].size() - 1] = -landscape_value;
              std::push_heap(this->values_of_landscapes[i].begin(), this->values_of_landscapes[i].end());
            }
          } else {
            // in this case we are still filling in the array.
            this->values_of_landscapes[i].push_back(-landscape_value);
            if (this->values_of_landscapes[i].size() == number_of_levels - 1) {
              // this->values_of_landscapes[i].size() == number_of_levels
              // in this case we need to create the heap.
              std::make_heap(this->values_of_landscapes[i].begin(), this->values_of_landscapes[i].end());
            }
          }
        } else {
          this->values_of_landscapes[i].push_back(landscape_value);
        }

        if (dbg) {
          std::clog << "Adding landscape value (going down) for a point : " << i << " equal : " << landscape_value
                    << std::endl;
        }
      }
      landscape_value -= dx;
    }
  }

  if (number_of_levels != std::numeric_limits<unsigned>::max()) {
    // in this case, vectors are used as heaps. And, since we want to have the smallest element at the top of
    // each heap, we store minus distances. To get if right at the end, we need to multiply each value
    // in the heap by -1 to get real vector of distances.
    for (size_t pt = 0; pt != this->values_of_landscapes.size(); ++pt) {
      for (size_t j = 0; j != this->values_of_landscapes[pt].size(); ++j) {
        this->values_of_landscapes[pt][j] *= -1;
      }
    }
  }

  // and now we need to sort the values:
  for (size_t pt = 0; pt != this->values_of_landscapes.size(); ++pt) {
    std::sort(this->values_of_landscapes[pt].begin(), this->values_of_landscapes[pt].end(), std::greater<double>());
  }
}